

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  bool value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  value = UnitTest::Passed(unit_test);
  FormatBool_abi_cxx11_(&local_30,this,value);
  std::operator+(&local_50,"event=TestProgramEnd&passed=",&local_30);
  SendLn(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  (*((this->socket_writer_).ptr_)->_vptr_AbstractSocketWriter[3])();
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    SendLn("event=TestProgramEnd&passed=" + FormatBool(unit_test.Passed()));

    // Notify the streaming server to stop.
    socket_writer_->CloseConnection();
  }